

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

bool __thiscall
fmt::v8::detail::write_int_localized<fmt::v8::appender,unsigned__int128,char>
          (detail *this,appender *out,unsigned___int128 value,uint prefix,
          basic_format_specs<char> *specs,locale_ref loc)

{
  detail *pdVar1;
  char cVar2;
  undefined1 n [16];
  undefined1 value_00 [16];
  detail dVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> bVar7;
  int iVar8;
  char *pcVar9;
  char *pcVar10;
  long lVar11;
  char *pcVar12;
  uint uVar13;
  locale_ref in_R9;
  detail *pdVar15;
  uint uVar16;
  char digits [40];
  undefined8 in_stack_fffffffffffffd38;
  char *local_2b8;
  long local_2b0;
  char local_2a8 [16];
  detail local_298;
  undefined8 local_290;
  detail local_288 [48];
  anon_class_16_2_3f014a30 local_258;
  undefined1 local_248 [32];
  detail local_228 [504];
  ulong uVar14;
  
  thousands_sep_impl<char>((thousands_sep_result<char> *)local_248,in_R9);
  local_2b8 = local_2a8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2b8,local_248._0_8_,(detail *)(local_248._8_8_ + local_248._0_8_));
  local_298 = local_228[0];
  local_290 = loc.locale_;
  if ((undefined1 *)local_248._0_8_ != local_248 + 0x10) {
    operator_delete((void *)local_248._0_8_);
  }
  dVar3 = local_298;
  if (local_298 != (detail)0x0) {
    n._8_8_ = this;
    n._0_8_ = in_stack_fffffffffffffd38;
    uVar4 = count_digits_fallback<unsigned__int128>((detail *)out,(unsigned___int128)n);
    pcVar12 = local_2b8 + local_2b0;
    pcVar10 = local_2b8;
    uVar6 = uVar4;
    uVar5 = uVar4;
    if (local_2b0 != 0) {
      pcVar9 = local_2b8;
      lVar11 = local_2b0;
      uVar14 = (ulong)uVar4;
      uVar16 = uVar4;
      do {
        cVar2 = *pcVar9;
        iVar8 = (int)uVar14;
        uVar13 = iVar8 - cVar2;
        uVar14 = (ulong)uVar13;
        pcVar10 = pcVar9;
        uVar6 = uVar16;
        if ((uVar13 == 0 || iVar8 < cVar2) || ((byte)(cVar2 + 0x81U) < 0x82)) break;
        uVar16 = uVar16 + 1;
        pcVar9 = pcVar9 + 1;
        lVar11 = lVar11 + -1;
        pcVar10 = pcVar12;
        uVar6 = uVar4 + (int)local_2b0;
        uVar5 = uVar13;
      } while (lVar11 != 0);
    }
    if (pcVar10 == pcVar12) {
      uVar6 = (int)(uVar5 - 1) / (int)pcVar12[-1] + uVar6;
    }
    value_00._8_8_ = this;
    value_00._0_8_ = in_stack_fffffffffffffd38;
    format_decimal<char,unsigned__int128>(local_288,(char *)out,(unsigned___int128)value_00,prefix);
    local_248._16_8_ = 0;
    local_248._0_8_ = &PTR_grow_001593f0;
    local_248._8_8_ = local_228;
    local_248._24_8_ = 500;
    local_258.size = (uVar6 + 1) - (uint)((int)specs == 0);
    uVar14 = (ulong)(uint)local_258.size;
    if (500 < (uint)local_258.size) {
      basic_memory_buffer<char,_500UL,_std::allocator<char>_>::grow
                ((basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)local_248,uVar14);
    }
    local_248._16_8_ = local_248._24_8_;
    if (uVar14 <= (ulong)local_248._24_8_) {
      local_248._16_8_ = uVar14;
    }
    pdVar15 = (detail *)(local_248._8_8_ + (long)local_258.size + -1);
    if (1 < (int)uVar4) {
      lVar11 = (ulong)uVar4 + 1;
      iVar8 = 0;
      pcVar12 = local_2b8;
      do {
        pdVar1 = pdVar15 + -1;
        *pdVar15 = local_288[lVar11 + -2];
        cVar2 = *pcVar12;
        if ('\0' < cVar2) {
          iVar8 = iVar8 + 1;
          if ((cVar2 != '\x7f') && (iVar8 % (int)cVar2 == 0)) {
            if (pcVar12 + 1 != local_2b8 + local_2b0) {
              iVar8 = 0;
              pcVar12 = pcVar12 + 1;
            }
            pdVar15[-1] = local_298;
            pdVar1 = pdVar15 + -2;
          }
        }
        pdVar15 = pdVar1;
        lVar11 = lVar11 + -1;
      } while (2 < lVar11);
    }
    *pdVar15 = local_288[0];
    if ((int)specs != 0) {
      pdVar15[-1] = SUB81(specs,0);
    }
    local_258.data = (char *)local_248._8_8_;
    bVar7.container =
         (buffer<char> *)
         write_padded<(fmt::v8::align::type)2,fmt::v8::appender,char,fmt::v8::detail::write_int_localized<fmt::v8::appender,unsigned__int128,char>(fmt::v8::appender&,unsigned__int128,unsigned_int,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::locale_ref)::_lambda(fmt::v8::appender)_1_>
                   (*(buffer<char> **)this,(basic_format_specs<char> *)local_290,uVar14,uVar14,
                    &local_258);
    *(buffer<char> **)this = bVar7.container;
    if ((detail *)local_248._8_8_ != local_228) {
      operator_delete((void *)local_248._8_8_);
    }
  }
  if (local_2b8 != local_2a8) {
    operator_delete(local_2b8);
  }
  return dVar3 != (detail)0x0;
}

Assistant:

auto write_int_localized(OutputIt& out, UInt value, unsigned prefix,
                         const basic_format_specs<Char>& specs, locale_ref loc)
    -> bool {
  static_assert(std::is_same<uint64_or_128_t<UInt>, UInt>::value, "");
  const auto sep_size = 1;
  auto ts = thousands_sep<Char>(loc);
  if (!ts.thousands_sep) return false;
  int num_digits = count_digits(value);
  int size = num_digits, n = num_digits;
  const std::string& groups = ts.grouping;
  std::string::const_iterator group = groups.cbegin();
  while (group != groups.cend() && n > *group && *group > 0 &&
         *group != max_value<char>()) {
    size += sep_size;
    n -= *group;
    ++group;
  }
  if (group == groups.cend()) size += sep_size * ((n - 1) / groups.back());
  char digits[40];
  format_decimal(digits, value, num_digits);
  basic_memory_buffer<Char> buffer;
  if (prefix != 0) ++size;
  const auto usize = to_unsigned(size);
  buffer.resize(usize);
  basic_string_view<Char> s(&ts.thousands_sep, sep_size);
  // Index of a decimal digit with the least significant digit having index 0.
  int digit_index = 0;
  group = groups.cbegin();
  auto p = buffer.data() + size - 1;
  for (int i = num_digits - 1; i > 0; --i) {
    *p-- = static_cast<Char>(digits[i]);
    if (*group <= 0 || ++digit_index % *group != 0 ||
        *group == max_value<char>())
      continue;
    if (group + 1 != groups.cend()) {
      digit_index = 0;
      ++group;
    }
    std::uninitialized_copy(s.data(), s.data() + s.size(),
                            make_checked(p, s.size()));
    p -= s.size();
  }
  *p-- = static_cast<Char>(*digits);
  if (prefix != 0) *p = static_cast<Char>(prefix);
  auto data = buffer.data();
  out = write_padded<align::right>(
      out, specs, usize, usize, [=](reserve_iterator<OutputIt> it) {
        return copy_str<Char>(data, data + size, it);
      });
  return true;
}